

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetObservationProbability
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  Index in_ECX;
  Index in_EDX;
  Index in_ESI;
  Index in_R8D;
  
  GetObservationProbability
            ((MultiAgentDecisionProcessDiscreteFactoredStates *)
             (&(this->super_MultiAgentDecisionProcess).field_0x0 +
             *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x138)),in_ESI,in_EDX,
             in_ECX,in_R8D);
  return;
}

Assistant:

double MultiAgentDecisionProcessDiscreteFactoredStates::
GetObservationProbability  (Index sI, Index jaI, Index sucSI, Index joI) const
{
    if(_m_cached_FlatOM)
        return _m_p_oModel->Get(sI, jaI, sucSI, joI);
    vector<Index> X = StateIndexToFactorValueIndices(sI);
    vector<Index> O = JointToIndividualObservationIndices(joI);
    vector<Index> Y = StateIndexToFactorValueIndices(sucSI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    return(_m_2dbn.GetOProbability(X,A,Y,O));
}